

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O1

void cJSON_InsertItemInArray(cJSON *array,int which,cJSON *newitem)

{
  bool bVar1;
  cJSON *pcVar2;
  cJSON *pcVar3;
  cJSON **ppcVar4;
  
  ppcVar4 = &array->child;
  pcVar2 = (cJSON *)ppcVar4;
  do {
    pcVar2 = pcVar2->next;
    if (pcVar2 == (cJSON *)0x0) break;
    bVar1 = 0 < which;
    which = which + -1;
  } while (bVar1);
  if (pcVar2 == (cJSON *)0x0) {
    if (newitem != (cJSON *)0x0) {
      pcVar2 = *ppcVar4;
      if (*ppcVar4 != (cJSON *)0x0) {
        do {
          pcVar3 = pcVar2;
          pcVar2 = pcVar3->next;
        } while (pcVar3->next != (cJSON *)0x0);
        pcVar3->next = newitem;
        newitem->prev = pcVar3;
        return;
      }
      goto LAB_001031b4;
    }
  }
  else {
    newitem->next = pcVar2;
    newitem->prev = pcVar2->prev;
    pcVar2->prev = newitem;
    if (pcVar2 == *ppcVar4) {
LAB_001031b4:
      *ppcVar4 = newitem;
      return;
    }
    newitem->prev->next = newitem;
  }
  return;
}

Assistant:

void   cJSON_InsertItemInArray(cJSON *array,int which,cJSON *newitem)		{cJSON *c=array->child;while (c && which>0) c=c->next,which--;if (!c) {cJSON_AddItemToArray(array,newitem);return;}
	newitem->next=c;newitem->prev=c->prev;c->prev=newitem;if (c==array->child) array->child=newitem; else newitem->prev->next=newitem;}